

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  ulong uVar5;
  
  pxVar2 = (xmlChar *)(*xmlMallocAtomic)(10);
  if (pxVar2 == (xmlChar *)0x0) {
LAB_00163ec1:
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    xVar1 = *ctxt->input->cur;
    if ((byte)(xVar1 - 0x30) < 10) {
      *pxVar2 = xVar1;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        pxVar2[1] = '.';
        iVar4 = 10;
        uVar5 = 2;
        do {
          xmlNextChar(ctxt);
          xVar1 = *ctxt->input->cur;
          if (9 < (byte)(xVar1 - 0x30)) {
            pxVar2[uVar5 & 0xffffffff] = '\0';
            return pxVar2;
          }
          pxVar3 = pxVar2;
          if (iVar4 <= (int)uVar5 + 1) {
            iVar4 = iVar4 * 2;
            pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)iVar4);
            if (pxVar3 == (xmlChar *)0x0) {
              (*xmlFree)(pxVar2);
              goto LAB_00163ec1;
            }
          }
          pxVar3[uVar5] = xVar1;
          uVar5 = uVar5 + 1;
          pxVar2 = pxVar3;
        } while( true );
      }
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}